

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::AbstractDOMParser::reset(AbstractDOMParser *this)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  XMLSize_t index;
  BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *this_00;
  undefined4 extraout_var;
  long lVar4;
  DOMDocumentImpl *pDVar5;
  
  pDVar5 = this->fDocument;
  if ((pDVar5 != (DOMDocumentImpl *)0x0) && (this->fDocumentAdoptedByUser == false)) {
    this_00 = &this->fDocumentVector->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>;
    if (this_00 == (BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0) {
      this_00 = (BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      ((BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *)&this_00->_vptr_BaseRefVectorOf)->
      _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_0040a5e8;
      this_00->fAdoptedElems = true;
      this_00->fCurCount = 0;
      this_00->fMaxCount = 10;
      this_00->fElemList = (DOMDocumentImpl **)0x0;
      this_00->fMemoryManager = pMVar1;
      iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x50);
      this_00->fElemList = (DOMDocumentImpl **)CONCAT44(extraout_var,iVar3);
      lVar4 = 0;
      do {
        this_00->fElemList[lVar4] = (DOMDocumentImpl *)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      ((BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *)&this_00->_vptr_BaseRefVectorOf)->
      _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_0040a570;
      this->fDocumentVector = (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)this_00;
      pDVar5 = this->fDocument;
    }
    BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>::ensureExtraCapacity(this_00,1);
    XVar2 = this_00->fCurCount;
    this_00->fElemList[XVar2] = pDVar5;
    this_00->fCurCount = XVar2 + 1;
  }
  this->fDocument = (DOMDocumentImpl *)0x0;
  (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x1c])(this);
  this->fWithinElement = false;
  this->fDocumentAdoptedByUser = false;
  this->fCurrentParent = (DOMNode *)0x0;
  this->fCurrentNode = (DOMNode *)0x0;
  this->fCurrentEntity = (DOMEntityImpl *)0x0;
  this->fInternalSubset->fIndex = 0;
  return;
}

Assistant:

void AbstractDOMParser::reset()
{
    // if fDocument exists already, store the old pointer in the vector for deletion later
    if (fDocument && !fDocumentAdoptedByUser) {
        if (!fDocumentVector) {
            // allocate the vector if not exists yet
            fDocumentVector  = new (fMemoryManager) RefVectorOf<DOMDocumentImpl>(10, true, fMemoryManager) ;
        }
        fDocumentVector->addElement(fDocument);
    }

    fDocument = 0;
    resetDocType();
    fCurrentParent   = 0;
    fCurrentNode     = 0;
    fCurrentEntity   = 0;
    fWithinElement   = false;
    fDocumentAdoptedByUser = false;
    fInternalSubset.reset();
}